

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_predictor_4x4_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  __m128i d;
  undefined1 auVar10 [16];
  __m128i rep;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar4 = _DAT_004df380;
  auVar3 = _DAT_004df370;
  uVar1 = *(uint *)left;
  uVar2 = *(undefined4 *)above;
  auVar9 = pshuflw(ZEXT116(above[3]),ZEXT116(above[3]),0);
  auVar10 = pshuflw(ZEXT116(left[3]),ZEXT116(left[3]),0);
  auVar6[0] = (byte)uVar2;
  auVar6[1] = 0;
  auVar8._0_12_ = ZEXT712(0);
  auVar8[0xc] = (char)((uint)uVar2 >> 0x18);
  auVar8[0xd] = 0;
  auVar8._14_2_ = auVar10._6_2_;
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._0_10_ = (unkuint10)0;
  auVar7._10_2_ = auVar10._4_2_;
  auVar6[9] = 0;
  auVar6[8] = (byte)((uint)uVar2 >> 0x10);
  auVar6._10_6_ = auVar7._10_6_;
  auVar6._6_2_ = auVar10._2_2_;
  auVar6[5] = 0;
  auVar6[4] = (byte)((uint)uVar2 >> 8);
  auVar6._2_2_ = auVar10._0_2_;
  iVar5 = 4;
  auVar7 = _DAT_004df350;
  auVar8 = _DAT_004df1c0;
  do {
    auVar10 = pshufb(ZEXT816(0x400055009500ff),auVar7);
    auVar15 = pshufb(auVar3,auVar7);
    auVar14._0_12_ = auVar10._0_12_;
    auVar14._12_2_ = auVar10._6_2_;
    auVar14._14_2_ = auVar15._6_2_;
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._0_10_ = auVar10._0_10_;
    auVar13._10_2_ = auVar15._4_2_;
    auVar12._10_6_ = auVar13._10_6_;
    auVar12._0_8_ = auVar10._0_8_;
    auVar12._8_2_ = auVar10._4_2_;
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._6_2_ = auVar15._2_2_;
    auVar11._4_2_ = auVar10._2_2_;
    auVar11._0_2_ = auVar10._0_2_;
    auVar11._2_2_ = auVar15._0_2_;
    auVar10 = pmaddwd(auVar11,auVar6);
    auVar15 = pshufb(ZEXT416(uVar1),auVar8);
    auVar19._0_12_ = auVar15._0_12_;
    auVar19._12_2_ = auVar15._6_2_;
    auVar19._14_2_ = auVar9._2_2_;
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._0_10_ = auVar15._0_10_;
    auVar18._10_2_ = auVar9._0_2_;
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._0_8_ = auVar15._0_8_;
    auVar17._8_2_ = auVar15._4_2_;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._6_2_ = auVar9._2_2_;
    auVar16._4_2_ = auVar15._2_2_;
    auVar16._0_2_ = auVar15._0_2_;
    auVar16._2_2_ = auVar9._0_2_;
    auVar15 = pmaddwd(auVar16,auVar4);
    auVar20._0_4_ = auVar15._0_4_ + auVar10._0_4_ + 0x100U >> 9;
    auVar20._4_4_ = auVar15._4_4_ + auVar10._4_4_ + 0x100U >> 9;
    auVar20._8_4_ = auVar15._8_4_ + auVar10._8_4_ + 0x100U >> 9;
    auVar20._12_4_ = auVar15._12_4_ + auVar10._12_4_ + 0x100U >> 9;
    auVar10 = pshufb(auVar20,ZEXT416(0xc080400));
    *(int *)dst = auVar10._0_4_;
    dst = dst + stride;
    auVar15._0_2_ = auVar8._0_2_ + 1;
    auVar15._2_2_ = auVar8._2_2_ + 1;
    auVar15._4_2_ = auVar8._4_2_ + 1;
    auVar15._6_2_ = auVar8._6_2_ + 1;
    auVar15._8_2_ = auVar8._8_2_ + 1;
    auVar15._10_2_ = auVar8._10_2_ + 1;
    auVar15._12_2_ = auVar8._12_2_ + 1;
    auVar15._14_2_ = auVar8._14_2_ + 1;
    auVar10._0_2_ = auVar7._0_2_ + 0x202;
    auVar10._2_2_ = auVar7._2_2_ + 0x202;
    auVar10._4_2_ = auVar7._4_2_ + 0x202;
    auVar10._6_2_ = auVar7._6_2_ + 0x202;
    auVar10._8_2_ = auVar7._8_2_ + 0x202;
    auVar10._10_2_ = auVar7._10_2_ + 0x202;
    auVar10._12_2_ = auVar7._12_2_ + 0x202;
    auVar10._14_2_ = auVar7._14_2_ + 0x202;
    iVar5 = iVar5 + -1;
    auVar7 = auVar10;
    auVar8 = auVar15;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline void load_pixel_w4(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  __m128i d = _mm_cvtsi32_si128(((const int *)above)[0]);
  if (height == 4)
    pixels[1] = _mm_cvtsi32_si128(((const int *)left)[0]);
  else if (height == 8)
    pixels[1] = _mm_loadl_epi64(((const __m128i *)left));
  else
    pixels[1] = _mm_loadu_si128(((const __m128i *)left));

  pixels[2] = _mm_set1_epi16((int16_t)above[3]);

  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  const __m128i zero = _mm_setzero_si128();
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
}